

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O3

void __thiscall
slang::ast::DeclaredType::setFromDeclarator(DeclaredType *this,DeclaratorSyntax *decl)

{
  EqualsValueClauseSyntax *pEVar1;
  ExpressionSyntax *pEVar2;
  SourceLocation SVar3;
  
  if ((decl->dimensions).
      super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
      _M_extent_value != 0) {
    this->dimensions = &decl->dimensions;
  }
  pEVar1 = decl->initializer;
  if (pEVar1 != (EqualsValueClauseSyntax *)0x0) {
    pEVar2 = (pEVar1->expr).ptr;
    SVar3 = parsing::Token::location(&pEVar1->equals);
    this->initializerSyntax = pEVar2;
    this->initializerLocation = SVar3;
  }
  return;
}

Assistant:

void DeclaredType::setFromDeclarator(const DeclaratorSyntax& decl) {
    if (!decl.dimensions.empty())
        setDimensionSyntax(decl.dimensions);
    if (decl.initializer)
        setInitializerSyntax(*decl.initializer->expr, decl.initializer->equals.location());
}